

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__horizontal_gather_4_channels_with_7_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float *pfVar37;
  long lVar38;
  
  pfVar1 = output_buffer + (output_sub_size << 2);
  pfVar37 = horizontal_coefficients + 4;
  do {
    lVar38 = (long)horizontal_contributors->n0;
    fVar9 = pfVar37[-4];
    fVar10 = pfVar37[-3];
    fVar11 = pfVar37[-2];
    fVar12 = pfVar37[-1];
    pfVar2 = decode_buffer + lVar38 * 4;
    fVar13 = pfVar2[1];
    fVar14 = pfVar2[2];
    fVar15 = pfVar2[3];
    pfVar3 = decode_buffer + lVar38 * 4 + 4;
    fVar16 = pfVar3[1];
    fVar17 = pfVar3[2];
    fVar18 = pfVar3[3];
    pfVar4 = decode_buffer + lVar38 * 4 + 8;
    fVar19 = pfVar4[1];
    fVar20 = pfVar4[2];
    fVar21 = pfVar4[3];
    pfVar5 = decode_buffer + lVar38 * 4 + 0xc;
    fVar22 = pfVar5[1];
    fVar23 = pfVar5[2];
    fVar24 = pfVar5[3];
    fVar25 = *pfVar37;
    fVar26 = pfVar37[1];
    fVar27 = pfVar37[2];
    pfVar6 = decode_buffer + lVar38 * 4 + 0x10;
    fVar28 = pfVar6[1];
    fVar29 = pfVar6[2];
    fVar30 = pfVar6[3];
    pfVar7 = decode_buffer + lVar38 * 4 + 0x14;
    fVar31 = pfVar7[1];
    fVar32 = pfVar7[2];
    fVar33 = pfVar7[3];
    pfVar8 = decode_buffer + lVar38 * 4 + 0x18;
    fVar34 = pfVar8[1];
    fVar35 = pfVar8[2];
    fVar36 = pfVar8[3];
    *output_buffer =
         fVar27 * *pfVar8 + *pfVar6 * fVar25 + fVar11 * *pfVar4 + *pfVar2 * fVar9 +
         fVar26 * *pfVar7 + fVar12 * *pfVar5 + fVar10 * *pfVar3;
    output_buffer[1] =
         fVar27 * fVar34 + fVar28 * fVar25 + fVar11 * fVar19 + fVar13 * fVar9 +
         fVar26 * fVar31 + fVar12 * fVar22 + fVar10 * fVar16;
    output_buffer[2] =
         fVar27 * fVar35 + fVar29 * fVar25 + fVar11 * fVar20 + fVar14 * fVar9 +
         fVar26 * fVar32 + fVar12 * fVar23 + fVar10 * fVar17;
    output_buffer[3] =
         fVar27 * fVar36 + fVar30 * fVar25 + fVar11 * fVar21 + fVar15 * fVar9 +
         fVar26 * fVar33 + fVar12 * fVar24 + fVar10 * fVar18;
    horizontal_contributors = horizontal_contributors + 1;
    output_buffer = output_buffer + 4;
    pfVar37 = pfVar37 + coefficient_width;
  } while (output_buffer < pfVar1);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_7_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  stbir__3_coeff_setup();
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    stbir__3_coeff_remnant(4);
    stbir__store_output();
  } while ( output < output_end );
}